

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::createDirectory(DirWatcherGeneric *this,string *newdir)

{
  WatcherGeneric *pWVar1;
  FileWatcherImpl *pFVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  bool *pbVar6;
  mapped_type *ppDVar7;
  byte local_222;
  byte local_202;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  byte local_171;
  string local_170;
  byte local_149;
  undefined1 local_148 [7];
  bool skip;
  undefined1 local_128 [8];
  string link;
  string curPath;
  undefined1 local_e0 [8];
  FileInfo fi;
  string dir;
  DirWatcherGeneric *dw;
  string local_60;
  string local_40;
  string *local_20;
  string *newdir_local;
  DirWatcherGeneric *this_local;
  
  local_20 = newdir;
  newdir_local = (string *)this;
  FileSystem::dirRemoveSlashAtEnd(newdir);
  std::__cxx11::string::string((string *)&local_60,(string *)newdir);
  FileSystem::fileNameFromPath(&local_40,&local_60);
  std::__cxx11::string::operator=((string *)newdir,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  dir.field_2._8_8_ = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fi.Inode,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->DirSnap
                 ,newdir);
  FileSystem::dirAddSlashAtEnd((string *)&fi.Inode);
  FileInfo::FileInfo((FileInfo *)local_e0,(string *)&fi.Inode);
  bVar3 = FileInfo::isDirectory((FileInfo *)local_e0);
  if (((!bVar3) || (bVar3 = FileInfo::isReadable((FileInfo *)local_e0), !bVar3)) ||
     (bVar3 = FileSystem::isRemoteFS((string *)&fi.Inode), bVar3)) {
    this_local = (DirWatcherGeneric *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)(link.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_148,(string *)&fi.Inode);
    FileSystem::getLinkRealPath
              ((string *)local_128,(string *)local_148,(string *)((long)&link.field_2 + 8));
    std::__cxx11::string::~string((string *)local_148);
    local_149 = 0;
    bVar3 = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_128);
    if (bVar3) {
      pbVar6 = FileWatcher::followSymlinks(this->Watch->WatcherImpl->mFileWatcher);
      if ((*pbVar6 & 1U) == 0) {
        local_149 = 1;
      }
      pFVar2 = this->Watch->WatcherImpl;
      local_171 = 0;
      uVar4 = (*pFVar2->_vptr_FileWatcherImpl[10])(pFVar2,local_128);
      local_202 = 1;
      if ((uVar4 & 1) == 0) {
        pWVar1 = this->Watch;
        std::__cxx11::string::string((string *)&local_170,(string *)local_128);
        local_171 = 1;
        bVar3 = WatcherGeneric::pathInWatches(pWVar1,&local_170);
        local_202 = 1;
        if (!bVar3) {
          pFVar2 = this->Watch->WatcherImpl;
          iVar5 = (*pFVar2->_vptr_FileWatcherImpl[9])
                            (pFVar2,(undefined1 *)((long)&link.field_2 + 8),local_128);
          local_202 = (byte)iVar5 ^ 0xff;
        }
      }
      if ((local_171 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_170);
      }
      if ((local_202 & 1) == 0) {
        std::__cxx11::string::operator=((string *)&fi.Inode,(string *)local_128);
      }
      else {
        local_149 = 1;
      }
    }
    else {
      pWVar1 = this->Watch;
      std::__cxx11::string::string((string *)&local_198,(string *)&fi.Inode);
      bVar3 = WatcherGeneric::pathInWatches(pWVar1,&local_198);
      local_222 = 1;
      if (!bVar3) {
        pFVar2 = this->Watch->WatcherImpl;
        iVar5 = (*pFVar2->_vptr_FileWatcherImpl[10])(pFVar2,&fi.Inode);
        local_222 = (byte)iVar5;
      }
      std::__cxx11::string::~string((string *)&local_198);
      if ((local_222 & 1) != 0) {
        local_149 = 1;
      }
    }
    if ((local_149 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1b9);
      handleAction(this,newdir,1,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      dir.field_2._8_8_ = operator_new(0xc0);
      DirWatcherGeneric((DirWatcherGeneric *)dir.field_2._8_8_,this,this->Watch,(string *)&fi.Inode,
                        (bool)(this->Recursive & 1),false);
      addChilds((DirWatcherGeneric *)dir.field_2._8_8_,true);
      watch((DirWatcherGeneric *)dir.field_2._8_8_,false);
      ppDVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
                ::operator[](&this->Directories,newdir);
      *ppDVar7 = (mapped_type)dir.field_2._8_8_;
    }
    this_local = (DirWatcherGeneric *)dir.field_2._8_8_;
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)(link.field_2._M_local_buf + 8));
  }
  FileInfo::~FileInfo((FileInfo *)local_e0);
  std::__cxx11::string::~string((string *)&fi.Inode);
  return this_local;
}

Assistant:

DirWatcherGeneric * DirWatcherGeneric::createDirectory( std::string newdir )
{
	FileSystem::dirRemoveSlashAtEnd( newdir );
	newdir = FileSystem::fileNameFromPath( newdir );

	DirWatcherGeneric * dw = NULL;

	/// Check if the directory is a symbolic link
	std::string dir( DirSnap.DirectoryInfo.Filepath + newdir );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() || !fi.isReadable() || FileSystem::isRemoteFS( dir ) )
	{
		return NULL;
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );
	bool skip = false;

	if ( "" != link )
	{
		/// Avoid adding symlinks directories if it's now enabled
		if ( !Watch->WatcherImpl->mFileWatcher->followSymlinks() )
		{
			skip = true;
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( Watch->WatcherImpl->pathInWatches( link ) || Watch->pathInWatches( link ) || !Watch->WatcherImpl->linkAllowed( curPath, link ) )
		{
			skip = true;
		}
		else
		{
			dir = link;
		}
	}
	else
	{
		if ( Watch->pathInWatches( dir ) || Watch->WatcherImpl->pathInWatches( dir ) )
		{
			skip = true;
		}
	}

	if ( !skip )
	{
		handleAction( newdir, Actions::Add );

		/// Creates the new directory watcher of the subfolder and check for new files
		dw = new DirWatcherGeneric( this, Watch, dir, Recursive );
		
		dw->addChilds();

		dw->watch();

		/// Add it to the list of directories
		Directories[ newdir ] = dw;
	}

	return dw;
}